

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

LY_ERR lyb_parse_node_leaf(lyd_lyb_ctx *lybctx,lyd_node *parent,lysc_node *snode,lyd_node **first_p,
                          ly_set *parsed)

{
  uint32_t local_54;
  lyd_meta *plStack_50;
  uint32_t flags;
  lyd_meta *meta;
  lyd_node *node;
  ly_set *plStack_38;
  LY_ERR ret;
  ly_set *parsed_local;
  lyd_node **first_p_local;
  lysc_node *snode_local;
  lyd_node *parent_local;
  lyd_lyb_ctx *lybctx_local;
  
  meta = (lyd_meta *)0x0;
  plStack_50 = (lyd_meta *)0x0;
  plStack_38 = parsed;
  parsed_local = (ly_set *)first_p;
  first_p_local = (lyd_node **)snode;
  snode_local = (lysc_node *)parent;
  parent_local = (lyd_node *)lybctx;
  node._4_4_ = lyb_parse_node_header(lybctx,snode,&local_54,&stack0xffffffffffffffb0);
  if ((node._4_4_ == LY_SUCCESS) &&
     (node._4_4_ = lyb_create_term((lyd_lyb_ctx *)parent_local,(lysc_node *)first_p_local,
                                   (lyd_node **)&meta), node._4_4_ == LY_SUCCESS)) {
    if (meta == (lyd_meta *)0x0) {
      __assert_fail("node",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                    ,0x559,
                    "LY_ERR lyb_parse_node_leaf(struct lyd_lyb_ctx *, struct lyd_node *, const struct lysc_node *, struct lyd_node **, struct ly_set *)"
                   );
    }
    ly_log_location((lysc_node *)0x0,(lyd_node *)meta,(char *)0x0,(ly_in *)0x0);
    lyb_finish_node((lyd_lyb_ctx *)parent_local,(lyd_node *)snode_local,local_54,
                    &stack0xffffffffffffffb0,(lyd_node **)&meta,(lyd_node **)parsed_local,plStack_38
                   );
    ly_log_location_revert(0,1,0,0);
    lybctx_local._4_4_ = LY_SUCCESS;
  }
  else {
    lyd_free_meta_siblings(plStack_50);
    lyd_free_tree((lyd_node *)meta);
    lybctx_local._4_4_ = node._4_4_;
  }
  return lybctx_local._4_4_;
}

Assistant:

static LY_ERR
lyb_parse_node_leaf(struct lyd_lyb_ctx *lybctx, struct lyd_node *parent, const struct lysc_node *snode,
        struct lyd_node **first_p, struct ly_set *parsed)
{
    LY_ERR ret;
    struct lyd_node *node = NULL;
    struct lyd_meta *meta = NULL;
    uint32_t flags;

    /* read necessary basic data */
    ret = lyb_parse_node_header(lybctx, snode, &flags, &meta);
    LY_CHECK_GOTO(ret, error);

    /* read value of term node and create it */
    ret = lyb_create_term(lybctx, snode, &node);
    LY_CHECK_GOTO(ret, error);

    assert(node);
    LOG_LOCSET(NULL, node);

    lyb_finish_node(lybctx, parent, flags, &meta, &node, first_p, parsed);

    LOG_LOCBACK(0, 1);
    return LY_SUCCESS;

error:
    lyd_free_meta_siblings(meta);
    lyd_free_tree(node);
    return ret;
}